

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

LY_ERR yang_print_parsed_module(ly_out *out,lysp_module *modp,uint32_t options)

{
  lys_module *plVar1;
  lysp_revision *plVar2;
  uint uVar3;
  char *text;
  lysp_ext_instance *plVar4;
  lysp_ext_instance *plVar5;
  long lVar6;
  lys_ypr_ctx pctx_;
  anon_union_24_2_d9db4c5a_for_lys_ypr_ctx_0 local_50;
  undefined4 local_38;
  
  plVar1 = modp->mod;
  local_50._8_4_ = 0;
  local_38 = 0;
  local_50.field_0.out = out;
  local_50.field_0.options = options;
  local_50.field_0.module = plVar1;
  ly_print_(out,"%*smodule %s {\n",0,"");
  local_50.field_0.level = local_50.field_0.level + 1;
  if (modp->version != '\0') {
    text = "1";
    if (modp->version == '\x02') {
      text = "1.1";
    }
    ypr_substmt((lys_ypr_ctx *)&local_50.field_0,LY_STMT_YANG_VERSION,'\0',text,'\0',modp->exts);
  }
  ypr_substmt((lys_ypr_ctx *)&local_50.field_0,LY_STMT_NAMESPACE,'\0',plVar1->ns,'\0',modp->exts);
  ypr_substmt((lys_ypr_ctx *)&local_50.field_0,LY_STMT_PREFIX,'\0',plVar1->prefix,'\0',modp->exts);
  local_50._8_4_ = local_50._8_4_ | 0x10000;
  yang_print_parsed_linkage((lys_ypr_ctx *)&local_50.field_0,modp);
  if (((((plVar1->org != (char *)0x0) || (plVar1->contact != (char *)0x0)) ||
       (plVar1->dsc != (char *)0x0)) || (plVar1->ref != (char *)0x0)) &&
     (((local_50._8_4_ & 0x10000) != 0 &&
      (local_50._8_4_ = local_50._8_4_ & 0xfffeffff, (local_50.field_0.options & 2) == 0)))) {
    ly_print_(local_50.field_0.out,"\n");
  }
  ypr_substmt((lys_ypr_ctx *)&local_50.field_0,LY_STMT_ORGANIZATION,'\0',plVar1->org,'\0',modp->exts
             );
  ypr_substmt((lys_ypr_ctx *)&local_50.field_0,LY_STMT_CONTACT,'\0',plVar1->contact,'\0',modp->exts)
  ;
  ypr_substmt((lys_ypr_ctx *)&local_50.field_0,LY_STMT_DESCRIPTION,'\0',plVar1->dsc,'\0',modp->exts)
  ;
  ypr_substmt((lys_ypr_ctx *)&local_50.field_0,LY_STMT_REFERENCE,'\0',plVar1->ref,'\0',modp->exts);
  if (((plVar1->org != (char *)0x0) || (plVar1->contact != (char *)0x0)) ||
     ((plVar1->dsc != (char *)0x0 || (plVar1->ref != (char *)0x0)))) {
    local_50._8_4_ = local_50._8_4_ | 0x10000;
  }
  lVar6 = 0;
  plVar5 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar2 = modp->revs;
    if (plVar2 == (lysp_revision *)0x0) {
      plVar4 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar4 = plVar2[-1].exts;
    }
    if (plVar4 <= plVar5) break;
    if (((local_50._8_4_ & 0x10000) != 0) &&
       (local_50._8_4_ = local_50._8_4_ & 0xfffeffff, (local_50.field_0.options & 2) == 0)) {
      ly_print_(local_50.field_0.out,"\n");
    }
    yprp_revision((lys_ypr_ctx *)&local_50.field_0,(lysp_revision *)(modp->revs->date + lVar6));
    plVar5 = (lysp_ext_instance *)((long)&plVar5->name + 1);
    lVar6 = lVar6 + 0x28;
  }
  if (plVar2 != (lysp_revision *)0x0) {
    local_50._8_4_ = local_50._8_4_ | 0x10000;
  }
  yang_print_parsed_body((lys_ypr_ctx *)&local_50.field_0,modp);
  uVar3 = local_50._8_4_ - 1;
  local_50.field_0.level = (short)uVar3;
  uVar3 = (uVar3 & 0xffff) * 2;
  if ((local_50.field_0.options & 2) != 0) {
    uVar3 = 0;
  }
  ly_print_(out,"%*s}\n",(ulong)uVar3,"");
  ly_print_flush(out);
  return LY_SUCCESS;
}

Assistant:

LY_ERR
yang_print_parsed_module(struct ly_out *out, const struct lysp_module *modp, uint32_t options)
{
    LY_ARRAY_COUNT_TYPE u;
    const struct lys_module *module = modp->mod;
    struct lys_ypr_ctx pctx_ = {
        .out = out,
        .level = 0,
        .options = options,
        .module = module,
        .schema = LYS_YPR_PARSED
    }, *pctx = &pctx_;

    ly_print_(pctx->out, "%*smodule %s {\n", INDENT, module->name);
    LEVEL++;

    /* module-header-stmts */
    if (modp->version) {
        ypr_substmt(pctx, LY_STMT_YANG_VERSION, 0, modp->version == LYS_VERSION_1_1 ? "1.1" : "1", 0, modp->exts);
    }
    ypr_substmt(pctx, LY_STMT_NAMESPACE, 0, module->ns, 0, modp->exts);
    ypr_substmt(pctx, LY_STMT_PREFIX, 0, module->prefix, 0, modp->exts);

    YPR_EXTRA_LINE(1, pctx);

    /* linkage-stmts (import/include) */
    yang_print_parsed_linkage(pctx, modp);

    /* meta-stmts */
    if (module->org || module->contact || module->dsc || module->ref) {
        YPR_EXTRA_LINE_PRINT(pctx);
    }
    ypr_substmt(pctx, LY_STMT_ORGANIZATION, 0, module->org, 0, modp->exts);
    ypr_substmt(pctx, LY_STMT_CONTACT, 0, module->contact, 0, modp->exts);
    ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, module->dsc, 0, modp->exts);
    ypr_substmt(pctx, LY_STMT_REFERENCE, 0, module->ref, 0, modp->exts);

    YPR_EXTRA_LINE(module->org || module->contact || module->dsc || module->ref, pctx);

    /* revision-stmts */
    LY_ARRAY_FOR(modp->revs, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_revision(pctx, &modp->revs[u]);
    }

    YPR_EXTRA_LINE(modp->revs, pctx);

    /* body-stmts */
    yang_print_parsed_body(pctx, modp);

    LEVEL--;
    ly_print_(out, "%*s}\n", INDENT);
    ly_print_flush(out);

    return LY_SUCCESS;
}